

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

void Assimp::IFC::AssignAddedMeshes
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                *mesh_indices,aiNode *nd,ConversionData *param_3)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  uint *puVar6;
  reference puVar7;
  uint local_34;
  iterator iStack_30;
  uint i;
  const_iterator end;
  const_iterator it;
  ConversionData *param_2_local;
  aiNode *nd_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *mesh_indices_local;
  
  bVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                    (mesh_indices);
  if (!bVar2) {
    end._M_node = (_Base_ptr)
                  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  cbegin(mesh_indices);
    iStack_30 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::cend
                          (mesh_indices);
    sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                      (mesh_indices);
    nd->mNumMeshes = (uint)sVar4;
    auVar1 = ZEXT416(nd->mNumMeshes) * ZEXT816(4);
    uVar5 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    puVar6 = (uint *)operator_new__(uVar5);
    nd->mMeshes = puVar6;
    local_34 = 0;
    while( true ) {
      bVar3 = std::operator!=(&end,&stack0xffffffffffffffd0);
      bVar2 = false;
      if (bVar3) {
        bVar2 = local_34 < nd->mNumMeshes;
      }
      if (!bVar2) break;
      puVar7 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&end);
      nd->mMeshes[local_34] = *puVar7;
      local_34 = local_34 + 1;
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&end);
    }
  }
  return;
}

Assistant:

void AssignAddedMeshes(std::set<unsigned int>& mesh_indices,aiNode* nd,
    ConversionData& /*conv*/)
{
    if (!mesh_indices.empty()) {
		std::set<unsigned int>::const_iterator it = mesh_indices.cbegin();
		std::set<unsigned int>::const_iterator end = mesh_indices.cend();

        nd->mNumMeshes = static_cast<unsigned int>(mesh_indices.size());

        nd->mMeshes = new unsigned int[nd->mNumMeshes];
        for(unsigned int i = 0; it != end && i < nd->mNumMeshes; ++i, ++it) {
            nd->mMeshes[i] = *it;
        }
    }
}